

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cldouble.c
# Opt level: O2

int mpt_cldouble(longdouble *val,char *src,longdouble *range)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  longdouble in_ST0;
  char *end;
  
  if (src == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = 0;
    if (*src != '\0') {
      strtold(src,&end);
      if (end == src) {
        do {
          cVar1 = *src;
          if ((long)cVar1 == 0) {
            return 0;
          }
          ppuVar3 = __ctype_b_loc();
          src = src + 1;
        } while ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        iVar2 = -3;
      }
      else if ((range == (longdouble *)0x0) ||
              ((iVar2 = -2, *range <= in_ST0 && (in_ST0 <= range[1])))) {
        if (val != (longdouble *)0x0) {
          *val = in_ST0;
        }
        iVar2 = (int)end - (int)src;
      }
    }
  }
  return iVar2;
}

Assistant:

extern int mpt_cldouble(long double *val, const char *src, const long double range[2])
{
	long double tmp;
	char *end;
	
	if (!src) {
		return MPT_ERROR(BadArgument);
	}
	if (!*src) {
		return 0;
	}
	tmp = strtold(src, &end);
	
	if (end == src) {
		/* accept space as empty string */
		while (*src) {
			if (!isspace(*src++)) {
				return MPT_ERROR(BadType);
			}
		}
		return 0;
	}
	if (range && (range[0] > tmp || tmp > range[1])) {
		return MPT_ERROR(BadValue);
	}
	if (val) {
		*val = tmp;
	}
	return end - src;
}